

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::detail::SocketStream::get_local_ip_and_port(SocketStream *this,string *ip,int *port)

{
  int *in_stack_00000070;
  string *in_stack_00000078;
  socket_t in_stack_00000084;
  
  detail::get_local_ip_and_port(in_stack_00000084,in_stack_00000078,in_stack_00000070);
  return;
}

Assistant:

inline void SocketStream::get_local_ip_and_port(std::string &ip,
                                                int &port) const {
  return detail::get_local_ip_and_port(sock_, ip, port);
}